

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  int _h;
  int iVar1;
  int iVar2;
  Mat m;
  Mat borderm;
  
  if (((this->top == 0 && this->bottom == 0) && this->left == 0) && this->right == 0) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    iVar2 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    iVar1 = this->right + this->left + bottom_blob->w;
    if (iVar2 == 1) {
      Mat::create(top_blob,iVar1,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        return 0;
      }
      if (_elemsize != 1) {
        return 0;
      }
      copy_make_border_image<signed_char>
                (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
      return 0;
    }
    _h = this->bottom + this->top + bottom_blob->h;
    if (iVar2 == 3) {
      iVar2 = bottom_blob->c;
      Mat::create(top_blob,iVar1,_h,iVar2,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      for (iVar1 = 0; iVar2 != iVar1; iVar1 = iVar1 + 1) {
        Mat::channel(&m,bottom_blob,iVar1);
        Mat::channel(&borderm,top_blob,iVar1);
        if (_elemsize == 4) {
          copy_make_border_image<float>(&m,&borderm,this->top,this->left,this->type,this->value);
        }
        else if (_elemsize == 1) {
          copy_make_border_image<signed_char>
                    (&m,&borderm,this->top,this->left,this->type,(char)(int)this->value);
        }
        Mat::~Mat(&borderm);
        Mat::~Mat(&m);
      }
    }
    else if (iVar2 == 2) {
      Mat::create(top_blob,iVar1,_h,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_make_border_image<float>
                  (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
      }
      else if (_elemsize == 1) {
        copy_make_border_image<signed_char>
                  (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
      }
    }
  }
  return 0;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, value);
        else if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, value);
            else if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, value);
        }

        return 0;
    }

    return 0;
}